

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

void __thiscall Refal2::CRuleParser::afterVariableQualifier(CRuleParser *this)

{
  TVariableTypeTag type;
  TVariableName *pTVar1;
  allocator local_31;
  string local_30 [32];
  CRuleParser *local_10;
  CRuleParser *this_local;
  
  local_10 = this;
  if ((this->super_CQualifierParser).token.type == TT_Word) {
    this->state = (TState)afterDirection;
    *(undefined8 *)&this->field_0x1e80 = 0;
    type = this->variableTypeTag;
    pTVar1 = (TVariableName *)
             std::__cxx11::string::operator[]((ulong)&(this->super_CQualifierParser).token.word);
    CFunctionBuilder::AddVariable((CFunctionBuilder *)this,type,*pTVar1,&this->qualifier);
    std::__cxx11::string::erase((ulong)&(this->super_CQualifierParser).token.word,0);
    (this->super_CQualifierParser).token.position =
         (this->super_CQualifierParser).token.position + 1;
    wordAfterDirection(this);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"missing variable name",&local_31);
    error(this,(string *)local_30);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

void CRuleParser::afterVariableQualifier()
{
	if( token.type == TT_Word ) {
		state = &CRuleParser::afterDirection;
		CFunctionBuilder::AddVariable( variableTypeTag, token.word[0],
			&qualifier );
		token.word.erase( 0, 1 );
		token.position++;
		wordAfterDirection();
	} else {
		error( "missing variable name" );
	}
}